

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

void P_SpawnLinePortal(line_t_conflict *line)

{
  BYTE BVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  line_t_conflict *plVar5;
  FLinePortal *pFVar6;
  BYTE local_34;
  FLinePortal *port_1;
  int i;
  int mytag;
  FLinePortal *port;
  line_t_conflict *dst;
  line_t_conflict *line_local;
  
  if ((line->args[2] < 0) || (3 < line->args[2])) {
    if ((line->args[2] == 4) && (line->args[0] == 0)) {
      iVar3 = FTagManager::GetFirstLineID(&tagManager,line);
      for (port_1._0_4_ = 0; (int)port_1 < numlines; port_1._0_4_ = (int)port_1 + 1) {
        iVar4 = FTagManager::GetFirstLineID(&tagManager,lines + (int)port_1);
        if (((iVar4 == iVar3) && (lines[(int)port_1].args[0] == 1)) &&
           (lines[(int)port_1].special == 0x9c)) {
          uVar2 = TArray<FLinePortal,_FLinePortal>::Reserve(&linePortals,1);
          line->portalindex = uVar2;
          pFVar6 = TArray<FLinePortal,_FLinePortal>::Last(&linePortals);
          memset(pFVar6,0,0x48);
          pFVar6->mOrigin = (line_t *)line;
          pFVar6->mDestination = (line_t *)(lines + (int)port_1);
          pFVar6->mType = '\x03';
          pFVar6->mAlign = '\0';
          pFVar6->mDefFlags = '\x0f';
          uVar2 = TArray<FLinePortal,_FLinePortal>::Reserve(&linePortals,1);
          lines[(int)port_1].portalindex = uVar2;
          pFVar6 = TArray<FLinePortal,_FLinePortal>::Last(&linePortals);
          memset(pFVar6,0,0x48);
          pFVar6->mOrigin = (line_t *)(lines + (int)port_1);
          pFVar6->mDestination = (line_t *)line;
          pFVar6->mType = '\x03';
          pFVar6->mAlign = '\0';
          pFVar6->mDefFlags = '\x0f';
        }
      }
    }
  }
  else {
    plVar5 = FindDestination(line,line->args[0]);
    uVar2 = TArray<FLinePortal,_FLinePortal>::Reserve(&linePortals,1);
    line->portalindex = uVar2;
    pFVar6 = TArray<FLinePortal,_FLinePortal>::Last(&linePortals);
    memset(pFVar6,0,0x48);
    pFVar6->mOrigin = (line_t *)line;
    pFVar6->mDestination = (line_t *)plVar5;
    pFVar6->mType = (BYTE)line->args[2];
    if (pFVar6->mType == '\x03') {
      pFVar6->mAlign = '\0';
    }
    else {
      if ((line->args[3] < 0) || (2 < line->args[3])) {
        local_34 = '\0';
      }
      else {
        local_34 = (BYTE)line->args[3];
      }
      pFVar6->mAlign = local_34;
      if ((pFVar6->mType == '\x02') && (pFVar6->mAlign != '\0')) {
        Printf("\x1cGWarning: z-offsetting not allowed for interactive portals. Changing line %d to teleport-portal!\n"
               ,((long)line - (long)lines) / 0x98 & 0xffffffff,((long)line - (long)lines) % 0x98);
        pFVar6->mType = '\x01';
      }
    }
    if (pFVar6->mDestination != (line_t *)0x0) {
      if (pFVar6->mType == '\0') {
        BVar1 = '\x01';
      }
      else {
        BVar1 = '\x0f';
        if (pFVar6->mType == '\x01') {
          BVar1 = '\a';
        }
      }
      pFVar6->mDefFlags = BVar1;
    }
  }
  return;
}

Assistant:

void P_SpawnLinePortal(line_t* line)
{
	// portal destination is special argument #0
	line_t* dst = NULL;

	if (line->args[2] >= PORTT_VISUAL && line->args[2] <= PORTT_LINKED)
	{
		dst = FindDestination(line, line->args[0]);

		line->portalindex = linePortals.Reserve(1);
		FLinePortal *port = &linePortals.Last();

		memset(port, 0, sizeof(FLinePortal));
		port->mOrigin = line;
		port->mDestination = dst;
		port->mType = BYTE(line->args[2]);	// range check is done above.

		if (port->mType == PORTT_LINKED)
		{
			// Linked portals have no z-offset ever.
			port->mAlign = PORG_ABSOLUTE;
		}
		else
		{
			port->mAlign = BYTE(line->args[3] >= PORG_ABSOLUTE && line->args[3] <= PORG_CEILING ? line->args[3] : PORG_ABSOLUTE);
			if (port->mType == PORTT_INTERACTIVE && port->mAlign != PORG_ABSOLUTE)
			{
				// Due to the way z is often handled, these pose a major issue for parts of the code that needs to transparently handle interactive portals.
				Printf(TEXTCOLOR_RED "Warning: z-offsetting not allowed for interactive portals. Changing line %d to teleport-portal!\n", int(line - lines));
				port->mType = PORTT_TELEPORT;
			}
		}
		if (port->mDestination != NULL)
		{
			port->mDefFlags = port->mType == PORTT_VISUAL ? PORTF_VISIBLE : port->mType == PORTT_TELEPORT ? PORTF_TYPETELEPORT : PORTF_TYPEINTERACTIVE;
		}
	}
	else if (line->args[2] == PORTT_LINKEDEE && line->args[0] == 0)
	{
		// EE-style portals require that the first line ID is identical and the first arg of the two linked linedefs are 0 and 1 respectively.

		int mytag = tagManager.GetFirstLineID(line);

		for (int i = 0; i < numlines; i++)
		{
			if (tagManager.GetFirstLineID(&lines[i]) == mytag && lines[i].args[0] == 1 && lines[i].special == Line_SetPortal)
			{
				line->portalindex = linePortals.Reserve(1);
				FLinePortal *port = &linePortals.Last();

				memset(port, 0, sizeof(FLinePortal));
				port->mOrigin = line;
				port->mDestination = &lines[i];
				port->mType = PORTT_LINKED;
				port->mAlign = PORG_ABSOLUTE;
				port->mDefFlags = PORTF_TYPEINTERACTIVE;

				// we need to create the backlink here, too.
				lines[i].portalindex = linePortals.Reserve(1);
				port = &linePortals.Last();

				memset(port, 0, sizeof(FLinePortal));
				port->mOrigin = &lines[i];
				port->mDestination = line;
				port->mType = PORTT_LINKED;
				port->mAlign = PORG_ABSOLUTE;
				port->mDefFlags = PORTF_TYPEINTERACTIVE;
			}
		}
	}
	else
	{
		// undefined type
		return;
	}
}